

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int detach_get_closed(DETACH_HANDLE detach,_Bool *closed_value)

{
  int iVar1;
  AMQP_TYPE AVar2;
  AMQP_VALUE value;
  int get_single_value_result;
  AMQP_VALUE item_value;
  DETACH_INSTANCE *detach_instance;
  uint32_t item_count;
  int result;
  _Bool *closed_value_local;
  DETACH_HANDLE detach_local;
  
  if (detach == (DETACH_HANDLE)0x0) {
    detach_instance._4_4_ = 0x24d8;
  }
  else {
    _item_count = closed_value;
    closed_value_local = (_Bool *)detach;
    iVar1 = amqpvalue_get_composite_item_count(detach->composite_value,(uint32_t *)&detach_instance)
    ;
    if (iVar1 == 0) {
      if ((uint)detach_instance < 2) {
        *_item_count = false;
        detach_instance._4_4_ = 0;
      }
      else {
        value = amqpvalue_get_composite_item_in_place(detach->composite_value,1);
        if ((value == (AMQP_VALUE)0x0) ||
           (AVar2 = amqpvalue_get_type(value), AVar2 == AMQP_TYPE_NULL)) {
          *_item_count = false;
          detach_instance._4_4_ = 0;
        }
        else {
          iVar1 = amqpvalue_get_boolean(value,_item_count);
          if (iVar1 == 0) {
            detach_instance._4_4_ = 0;
          }
          else {
            AVar2 = amqpvalue_get_type(value);
            if (AVar2 == AMQP_TYPE_NULL) {
              *_item_count = false;
              detach_instance._4_4_ = 0;
            }
            else {
              detach_instance._4_4_ = 0x24f9;
            }
          }
        }
      }
    }
    else {
      detach_instance._4_4_ = 0x24e0;
    }
  }
  return detach_instance._4_4_;
}

Assistant:

int detach_get_closed(DETACH_HANDLE detach, bool* closed_value)
{
    int result;

    if (detach == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        uint32_t item_count;
        DETACH_INSTANCE* detach_instance = (DETACH_INSTANCE*)detach;
        if (amqpvalue_get_composite_item_count(detach_instance->composite_value, &item_count) != 0)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (item_count <= 1)
            {
                *closed_value = false;
                result = 0;
            }
            else
            {
                AMQP_VALUE item_value = amqpvalue_get_composite_item_in_place(detach_instance->composite_value, 1);
                if ((item_value == NULL) ||
                    (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL))
                {
                    *closed_value = false;
                    result = 0;
                }
                else
                {
                    int get_single_value_result = amqpvalue_get_boolean(item_value, closed_value);
                    if (get_single_value_result != 0)
                    {
                        if (amqpvalue_get_type(item_value) != AMQP_TYPE_NULL)
                        {
                            result = MU_FAILURE;
                        }
                        else
                        {
                            *closed_value = false;
                            result = 0;
                        }
                    }
                    else
                    {
                        result = 0;
                    }
                }
            }
        }
    }

    return result;
}